

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O3

fy_diag_cfg * fy_diag_cfg_from_document(fy_diag_cfg *cfg,fy_document *fyd)

{
  _Bool _Var1;
  fy_parse_cfg_flags fVar2;
  FILE *pFVar3;
  
  if (fyd == (fy_document *)0x0 || cfg == (fy_diag_cfg *)0x0) {
    cfg = (fy_diag_cfg *)0x0;
  }
  else {
    fy_diag_cfg_default(cfg);
    pFVar3 = fy_document_get_error_fp(fyd);
    cfg->fp = pFVar3;
    fVar2 = fy_document_get_cfg_flags(fyd);
    cfg->level = fVar2 >> 0xc & 0xf;
    cfg->module_mask = fVar2 >> 4 & 0xff;
    cfg->field_0x20 = (byte)(fVar2 >> 0xf) & 0x1e | cfg->field_0x20 & 0xe0;
    _Var1 = fy_document_is_colorized(fyd);
    cfg->field_0x20 = cfg->field_0x20 & 0xfe | _Var1;
  }
  return cfg;
}

Assistant:

struct fy_diag_cfg *fy_diag_cfg_from_document(struct fy_diag_cfg *cfg, struct fy_document *fyd) {
    if (!cfg || !fyd)
        return NULL;

    fy_diag_cfg_default(cfg);
    cfg->fp = fy_document_get_error_fp(fyd);
    fy_diag_cfg_from_parser_flags(cfg, fy_document_get_cfg_flags(fyd));
    cfg->colorize = fy_document_is_colorized(fyd);

    return cfg;
}